

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O2

void Gia_IsoPrepare(Gia_IsoMan_t *p)

{
  int *piVar1;
  Vec_Int_t *p_00;
  int iVar2;
  Gia_Obj_t *pGVar3;
  void *__ptr;
  undefined4 *__ptr_00;
  int iVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  
  *p->pLevels = 0;
  for (iVar4 = 0; iVar4 < p->pGia->vCis->nSize; iVar4 = iVar4 + 1) {
    pGVar3 = Gia_ManCi(p->pGia,iVar4);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    piVar1 = p->pLevels;
    iVar2 = Gia_ObjId(p->pGia,pGVar3);
    piVar1[iVar2] = 0;
  }
  lVar5 = 0;
  for (lVar7 = 0; lVar7 < p->pGia->nObjs; lVar7 = lVar7 + 1) {
    pGVar3 = Gia_ManObj(p->pGia,(int)lVar7);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    uVar8 = *(ulong *)pGVar3;
    if ((~(uint)uVar8 & 0x1fffffff) != 0 && -1 < (int)(uint)uVar8) {
      piVar1 = p->pLevels;
      iVar4 = *(int *)((long)piVar1 + ((long)((uVar8 & 0x1fffffff) * -0x100000000 + lVar5) >> 0x1e))
      ;
      iVar2 = *(int *)((long)piVar1 +
                      ((long)((uVar8 >> 0x20 & 0x1fffffff) * -0x100000000 + lVar5) >> 0x1e));
      if (iVar2 < iVar4) {
        iVar2 = iVar4;
      }
      piVar1[lVar7] = iVar2 + 1;
    }
    lVar5 = lVar5 + 0x100000000;
  }
  uVar6 = 0;
  for (iVar4 = 0; iVar4 < p->pGia->vCos->nSize; iVar4 = iVar4 + 1) {
    pGVar3 = Gia_ManCo(p->pGia,iVar4);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjId(p->pGia,pGVar3);
    piVar1 = p->pLevels;
    piVar1[iVar2] = piVar1[(int)(iVar2 - (*(uint *)pGVar3 & 0x1fffffff))] + 1;
    iVar2 = Gia_ObjId(p->pGia,pGVar3);
    if ((int)uVar6 <= piVar1[iVar2]) {
      uVar6 = piVar1[iVar2];
    }
  }
  __ptr = calloc((ulong)(uVar6 + 1),4);
  iVar4 = p->nObjs;
  for (lVar5 = 1; lVar5 < iVar4; lVar5 = lVar5 + 1) {
    piVar1 = (int *)((long)__ptr + (long)p->pLevels[lVar5] * 4);
    *piVar1 = *piVar1 + 1;
  }
  p_00 = p->vClasses;
  p_00->nSize = 0;
  uVar8 = 0;
  Vec_IntPush(p_00,0);
  iVar4 = 1;
  Vec_IntPush(p->vClasses,1);
  __ptr_00 = (undefined4 *)calloc((ulong)(uVar6 + 2),4);
  *__ptr_00 = 1;
  while( true ) {
    if (uVar6 < uVar8) {
      iVar4 = __ptr_00[uVar6 + 1];
      if (iVar4 == p->nObjs) {
        for (lVar5 = 1; lVar5 < iVar4; lVar5 = lVar5 + 1) {
          iVar4 = __ptr_00[p->pLevels[lVar5]];
          __ptr_00[p->pLevels[lVar5]] = iVar4 + 1;
          *(int *)((long)p->pStoreW + (long)iVar4 * 8 + 4) = (int)lVar5;
          iVar4 = p->nObjs;
        }
        free(__ptr_00);
        free(__ptr);
        return;
      }
      __assert_fail("pLevBegins[MaxLev+1] == p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIso.c"
                    ,0xf0,"void Gia_IsoPrepare(Gia_IsoMan_t *)");
    }
    iVar2 = *(int *)((long)__ptr + uVar8 * 4);
    if (iVar2 < 1) break;
    Vec_IntPush(p->vClasses,iVar4);
    Vec_IntPush(p->vClasses,iVar2);
    iVar4 = iVar4 + iVar2;
    __ptr_00[uVar8 + 1] = iVar4;
    uVar8 = uVar8 + 1;
  }
  __assert_fail("pLevSizes[i] > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIso.c"
                ,0xeb,"void Gia_IsoPrepare(Gia_IsoMan_t *)");
}

Assistant:

void Gia_IsoPrepare( Gia_IsoMan_t * p )
{
    Gia_Obj_t * pObj;
    int * pLevBegins, * pLevSizes;
    int i, iObj, MaxLev = 0;
    // assign levels
    p->pLevels[0] = 0;
    Gia_ManForEachCi( p->pGia, pObj, i )
        p->pLevels[Gia_ObjId(p->pGia, pObj)] = 0;
    Gia_ManForEachAnd( p->pGia, pObj, i )
        p->pLevels[i] = 1 + Abc_MaxInt( p->pLevels[Gia_ObjFaninId0(pObj, i)], p->pLevels[Gia_ObjFaninId1(pObj, i)] );
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iObj = Gia_ObjId(p->pGia, pObj);
        p->pLevels[iObj] = 1 + p->pLevels[Gia_ObjFaninId0(pObj, iObj)]; // "1 +" is different!
        MaxLev = Abc_MaxInt( MaxLev, p->pLevels[Gia_ObjId(p->pGia, pObj)] );
    }

    // count nodes on each level
    pLevSizes = ABC_CALLOC( int, MaxLev+1 );
    for ( i = 1; i < p->nObjs; i++ )
        pLevSizes[p->pLevels[i]]++;
    // start classes
    Vec_IntClear( p->vClasses );
    Vec_IntPush( p->vClasses, 0 );
    Vec_IntPush( p->vClasses, 1 );
    // find beginning of each level
    pLevBegins = ABC_CALLOC( int, MaxLev+2 );
    pLevBegins[0] = 1;
    for ( i = 0; i <= MaxLev; i++ )
    {
        assert( pLevSizes[i] > 0 ); // we do not allow AIG with a const node and no PIs
        Vec_IntPush( p->vClasses, pLevBegins[i] );
        Vec_IntPush( p->vClasses, pLevSizes[i] );
        pLevBegins[i+1] = pLevBegins[i] + pLevSizes[i];
    }
    assert( pLevBegins[MaxLev+1] == p->nObjs );
    // put them into the structure
    for ( i = 1; i < p->nObjs; i++ )
        Gia_IsoSetItem( p, pLevBegins[p->pLevels[i]]++, i );
    ABC_FREE( pLevBegins );
    ABC_FREE( pLevSizes );
/*
    // print the results
    for ( i = 0; i < p->nObjs; i++ )
        printf( "%3d : (%d,%d)\n", i, Gia_IsoGetItem(p, i), Gia_IsoGetValue(p, i) );
    printf( "\n" );
*/
}